

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::printList(Graph *this)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  int local_1c;
  int local_18;
  int j;
  int i;
  int nv;
  Graph *this_local;
  
  iVar1 = this->num_of_vert;
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"Successors");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_18 + 1);
    std::operator<<(poVar2,":");
    local_1c = 0;
    while( true ) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(this->adj_list + local_18);
      if ((int)sVar3 <= local_1c) break;
      poVar2 = std::operator<<((ostream *)&std::cout,"-> ");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this->adj_list + local_18,(long)local_1c);
      std::ostream::operator<<(poVar2,*pvVar4);
      local_1c = local_1c + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Graph::printList(){
   int nv = this->num_of_vert;
   cout << endl << "Successors" << endl;
   for(int i = 0; i < nv; i++){
      cout << i + 1 << ":";
      for(int j = 0; j < (int)adj_list[i].size(); j++)
         cout << "-> " << this->adj_list[i][j];
      cout << endl;
   }
   return void();
}